

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O2

void deqp::anon_unknown_13::setUniform(Functions *gl,deUint32 programID,char *name,float value)

{
  GLint GVar1;
  GLenum err;
  allocator<char> local_5d;
  GLfloat local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_5c = value;
  GVar1 = (*gl->getUniformLocation)(programID,name);
  (*gl->uniform1f)(GVar1,local_5c);
  err = (*gl->getError)();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Failed to set ",&local_5d)
  ;
  std::operator+(&local_58,&local_38,name);
  glu::checkError(err,local_58._M_dataplus._M_p,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderStructTests.cpp"
                  ,0x3f4);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void setUniform(const glw::Functions& gl, deUint32 programID, const char* name, float value)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1f(loc, value);
	CHECK_SET_UNIFORM(name);
}